

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xlfparser.h
# Opt level: O1

vector<xlfparser::Token,_std::allocator<xlfparser::Token>_> *
xlfparser::tokenize<wchar_t>
          (vector<xlfparser::Token,_std::allocator<xlfparser::Token>_> *__return_storage_ptr__,
          wchar_t *formula,size_t size,Options<wchar_t> *options)

{
  _Storage<wchar_t,_true> _Var1;
  wchar_t wVar2;
  Options<wchar_t> *options_00;
  bool bVar3;
  int iVar4;
  undefined4 uVar5;
  wostream *pwVar6;
  size_t sVar7;
  reference pvVar8;
  _Elt_pointer pTVar9;
  runtime_error *prVar10;
  undefined4 uVar11;
  pointer pTVar12;
  pointer size_00;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  vector<xlfparser::Token,_std::allocator<xlfparser::Token>_> *pvVar16;
  pointer pTVar17;
  pointer pTVar18;
  undefined **ppuVar19;
  wchar_t *pwVar20;
  wchar_t *__s;
  bool bVar21;
  stack<xlfparser::Token::Type,_std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>_>
  stack;
  basic_regex<wchar_t,_std::__cxx11::regex_traits<wchar_t>_> sn_regex;
  basic_stringstream<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> sn_regex_ss;
  undefined1 local_2c8 [20];
  Subtype SStack_2b4;
  wchar_t *pwStack_2b0;
  uint local_2a4;
  pointer local_2a0;
  uint local_294;
  wchar_t *local_290;
  uint local_284;
  pointer local_280;
  undefined1 local_278 [32];
  _Elt_pointer local_258;
  _Map_pointer ppTStack_250;
  _Elt_pointer local_248;
  _Elt_pointer pTStack_240;
  _Elt_pointer local_238;
  _Map_pointer ppTStack_230;
  vector<xlfparser::Token,_std::allocator<xlfparser::Token>_> *local_220;
  _Storage<wchar_t,_true> local_218;
  _Storage<wchar_t,_true> local_214;
  _Storage<wchar_t,_true> local_210;
  _Storage<wchar_t,_true> local_20c;
  _Storage<wchar_t,_true> local_208;
  _Storage<wchar_t,_true> local_204;
  pointer local_200;
  Options<wchar_t> *local_1f8;
  vector<xlfparser::Token,_std::allocator<xlfparser::Token>_> local_1f0;
  basic_regex<wchar_t,_std::__cxx11::regex_traits<wchar_t>_> local_1d8;
  wostream *local_1b8 [2];
  wostream local_1a8 [112];
  ios_base local_138 [264];
  
  if ((size < 2) || (*formula != L'=')) {
    prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_1b8[0] = local_1a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"Invalid Excel formula","");
    std::runtime_error::runtime_error(prVar10,(string *)local_1b8);
    *(undefined ***)prVar10 = &PTR__runtime_error_001b8900;
    __cxa_throw(prVar10,&invalid_formula::typeinfo,std::runtime_error::~runtime_error);
  }
  local_20c._M_value = L'{';
  if ((options->left_brace).super__Optional_base<wchar_t,_true,_true>._M_payload.
      super__Optional_payload_base<wchar_t>._M_engaged != false) {
    local_20c = (options->left_brace).super__Optional_base<wchar_t,_true,_true>._M_payload.
                super__Optional_payload_base<wchar_t>._M_payload;
  }
  local_208._M_value = L'[';
  if ((options->left_bracket).super__Optional_base<wchar_t,_true,_true>._M_payload.
      super__Optional_payload_base<wchar_t>._M_engaged != false) {
    local_208 = (options->left_bracket).super__Optional_base<wchar_t,_true,_true>._M_payload.
                super__Optional_payload_base<wchar_t>._M_payload;
  }
  bVar21 = (options->right_brace).super__Optional_base<wchar_t,_true,_true>._M_payload.
           super__Optional_payload_base<wchar_t>._M_engaged != false;
  _Var1 = (options->right_brace).super__Optional_base<wchar_t,_true,_true>._M_payload.
          super__Optional_payload_base<wchar_t>._M_payload;
  local_214._M_value = L'}';
  if (bVar21) {
    local_214 = _Var1;
  }
  local_204._M_value = L']';
  if (bVar21) {
    local_204 = _Var1;
  }
  local_218._M_value = L',';
  if ((options->list_separator).super__Optional_base<wchar_t,_true,_true>._M_payload.
      super__Optional_payload_base<wchar_t>._M_engaged != false) {
    local_218 = (options->list_separator).super__Optional_base<wchar_t,_true,_true>._M_payload.
                super__Optional_payload_base<wchar_t>._M_payload;
  }
  local_210._M_value = L';';
  if ((options->row_separator).super__Optional_base<wchar_t,_true,_true>._M_payload.
      super__Optional_payload_base<wchar_t>._M_engaged != false) {
    local_210 = (options->row_separator).super__Optional_base<wchar_t,_true,_true>._M_payload.
                super__Optional_payload_base<wchar_t>._M_payload;
  }
  wVar2 = (options->decimal_separator).super__Optional_base<wchar_t,_true,_true>._M_payload.
          super__Optional_payload_base<wchar_t>._M_payload._M_value;
  bVar21 = (options->decimal_separator).super__Optional_base<wchar_t,_true,_true>._M_payload.
           super__Optional_payload_base<wchar_t>._M_engaged;
  local_2a0 = (pointer)size;
  std::__cxx11::wstringstream::wstringstream((wstringstream *)local_1b8);
  pwVar6 = std::operator<<(local_1a8,"^[1-9](\\");
  local_278._0_4_ = L'.';
  if (bVar21 != false) {
    local_278._0_4_ = wVar2;
  }
  pwVar6 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(pwVar6,(wchar_t *)local_278,1);
  std::operator<<(pwVar6,"\\d+)?E[+-]\\d*$");
  std::__cxx11::wstringbuf::str();
  size_00 = local_2a0;
  std::__cxx11::basic_regex<wchar_t,std::__cxx11::regex_traits<wchar_t>>::
  basic_regex<std::char_traits<wchar_t>,std::allocator<wchar_t>>
            ((basic_regex<wchar_t,std::__cxx11::regex_traits<wchar_t>> *)&local_1d8,
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_278
             ,0x11);
  if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
    operator_delete((void *)local_278._0_8_,local_278._16_8_ * 4 + 4);
  }
  (__return_storage_ptr__->super__Vector_base<xlfparser::Token,_std::allocator<xlfparser::Token>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<xlfparser::Token,_std::allocator<xlfparser::Token>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<xlfparser::Token,_std::allocator<xlfparser::Token>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_238 = (_Elt_pointer)0x0;
  ppTStack_230 = (_Map_pointer)0x0;
  local_248 = (_Elt_pointer)0x0;
  pTStack_240 = (_Elt_pointer)0x0;
  local_258 = (_Elt_pointer)0x0;
  ppTStack_250 = (_Map_pointer)0x0;
  local_278._16_8_ = (void *)0x0;
  local_278._24_8_ = 0;
  local_278._0_8_ = (pointer)0x0;
  local_278._8_8_ = 0;
  local_220 = __return_storage_ptr__;
  std::_Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>::
  _M_initialize_map((_Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_> *)
                    local_278,0);
  pTVar18 = (pointer)0x1;
  local_284 = 0;
  uVar14 = 0;
  bVar21 = false;
  pvVar16 = (vector<xlfparser::Token,_std::allocator<xlfparser::Token>_> *)0x0;
  pTVar17 = (pointer)0x1;
  local_290 = formula;
  local_1f8 = options;
  do {
    wVar2 = formula[(long)pTVar17];
    pTVar12 = pTVar17;
    if (wVar2 == L'\0') break;
    pwVar20 = formula + (long)pTVar17;
    uVar13 = (uint)uVar14;
    if (((ulong)pvVar16 & 1) == 0) {
      if (bVar21) {
        if (wVar2 == L'\'') {
          pTVar12 = (pointer)((long)&((pair<const_wchar_t_*,_const_wchar_t_*> *)&pTVar17->m_start)->
                                     first + 2);
          if ((pTVar12 <= size_00) && (pwVar20[1] == L'\'')) goto LAB_001773f4;
          bVar21 = false;
          pTVar12 = pTVar17;
        }
        goto LAB_001773ee;
      }
      if ((uVar14 & 1) != 0) {
        uVar14 = uVar14 & 0xff;
        if (wVar2 == local_204._M_value) {
          uVar14 = 0;
        }
        goto LAB_001773ee;
      }
      if ((local_284 & 1) == 0) {
        if (pTVar18 < pTVar17) {
          stack0xfffffffffffffd48 = (pointer)0x0;
          pwStack_2b0 = (wchar_t *)0x0;
          local_2c8._0_8_ = (pointer)0x0;
          local_2c8._8_8_ = (pointer)0x0;
          local_280 = pTVar17;
          bVar3 = std::__detail::
                  __regex_algo_impl<wchar_t_const*,std::allocator<std::__cxx11::sub_match<wchar_t_const*>>,wchar_t,std::__cxx11::regex_traits<wchar_t>,(std::__detail::_RegexExecutorPolicy)0,true>
                            (formula + (long)pTVar18,pwVar20 + 1,
                             (match_results<const_wchar_t_*,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
                              *)local_2c8,&local_1d8,0);
          if ((pointer)local_2c8._0_8_ != (pointer)0x0) {
            operator_delete((void *)local_2c8._0_8_,(long)stack0xfffffffffffffd48 - local_2c8._0_8_)
            ;
          }
          pvVar16 = (vector<xlfparser::Token,_std::allocator<xlfparser::Token>_> *)
                    ((ulong)pvVar16 & 0xffffffff);
          size_00 = local_2a0;
          pTVar12 = local_280;
          __return_storage_ptr__ = local_220;
          formula = local_290;
          if (bVar3) goto LAB_001773ee;
        }
        wVar2 = *pwVar20;
        pvVar8 = (reference)(ulong)(uint)wVar2;
        uVar15 = (uint)pvVar16;
        if (wVar2 == L'\'') {
          if (pTVar18 < pTVar12) {
            local_2c8._8_8_ = (long)&pTVar12[-1].m_subtype + 3;
            stack0xfffffffffffffd48 = (pointer)0x0;
            local_2c8._0_8_ = pTVar18;
            std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
            emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)local_2c8);
            pvVar16 = (vector<xlfparser::Token,_std::allocator<xlfparser::Token>_> *)
                      ((ulong)pvVar16 & 0xffffffff);
            pTVar18 = pTVar12;
          }
          pTVar12 = (pointer)((long)&((pair<const_wchar_t_*,_const_wchar_t_*> *)&pTVar12->m_start)->
                                     first + 1);
          bVar21 = true;
        }
        else if (wVar2 == L'\"') {
          if (pTVar18 < pTVar12) {
            local_2c8._8_8_ = (long)&pTVar12[-1].m_subtype + 3;
            stack0xfffffffffffffd48 = (pointer)0x0;
            pvVar16 = __return_storage_ptr__;
            local_2c8._0_8_ = pTVar18;
            std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
            emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)local_2c8);
            pTVar18 = pTVar12;
          }
          pTVar12 = (pointer)((long)&((pair<const_wchar_t_*,_const_wchar_t_*> *)&pTVar12->m_start)->
                                     first + 1);
          pvVar16 = (vector<xlfparser::Token,_std::allocator<xlfparser::Token>_> *)
                    CONCAT71((int7)((ulong)pvVar16 >> 8),1);
        }
        else if (wVar2 == local_208._M_value) {
          pTVar12 = (pointer)((long)&((pair<const_wchar_t_*,_const_wchar_t_*> *)&pTVar12->m_start)->
                                     first + 1);
          uVar14 = CONCAT71((int7)(uVar14 >> 8),1);
        }
        else if (wVar2 == L'#') {
          if (pTVar18 < pTVar12) {
            local_2c8._8_8_ = (long)&pTVar12[-1].m_subtype + 3;
            stack0xfffffffffffffd48 = (pointer)0x0;
            local_2c8._0_8_ = pTVar18;
            pvVar8 = std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
                     emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)local_2c8);
            pvVar16 = (vector<xlfparser::Token,_std::allocator<xlfparser::Token>_> *)
                      ((ulong)pvVar16 & 0xffffffff);
            pTVar18 = pTVar12;
            formula = local_290;
          }
          pTVar12 = (pointer)((long)&((pair<const_wchar_t_*,_const_wchar_t_*> *)&pTVar12->m_start)->
                                     first + 1);
          local_284 = (uint)CONCAT71((int7)((ulong)pvVar8 >> 8),1);
        }
        else if (wVar2 == local_20c._M_value) {
          local_294 = uVar13;
          if (pTVar18 < pTVar12) {
            local_2c8._8_8_ = (long)&pTVar12[-1].m_subtype + 3;
            stack0xfffffffffffffd48 = (pointer)0x0;
            local_2c8._0_8_ = pTVar18;
            std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
            emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)local_2c8);
            pTVar18 = pTVar12;
          }
          stack0xfffffffffffffd48 = (pointer)0x100000003;
          local_2c8._0_8_ = pTVar18;
          local_2c8._8_8_ = pTVar12;
          std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
          emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)local_2c8);
          stack0xfffffffffffffd48 = (pointer)0x100000004;
          local_2c8._0_8_ = pTVar18;
          local_2c8._8_8_ = pTVar12;
          std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
          emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)local_2c8);
          local_2c8._0_4_ = 3;
          std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>::
          emplace_back<xlfparser::Token::Type>
                    ((deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_> *)
                     local_278,(Type *)local_2c8);
          local_2c8._0_4_ = 4;
          std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>::
          emplace_back<xlfparser::Token::Type>
                    ((deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_> *)
                     local_278,(Type *)local_2c8);
          uVar13 = local_294;
LAB_00177774:
          uVar14 = (ulong)uVar13;
          pTVar12 = (pointer)((long)&((pair<const_wchar_t_*,_const_wchar_t_*> *)&pTVar12->m_start)->
                                     first + 1);
          pvVar16 = (vector<xlfparser::Token,_std::allocator<xlfparser::Token>_> *)(ulong)uVar15;
          size_00 = local_2a0;
          pTVar18 = pTVar12;
        }
        else {
          if ((wVar2 == local_210._M_value) && (local_248 != (_Elt_pointer)local_278._16_8_)) {
            pTVar9 = local_248;
            if (local_248 == pTStack_240) {
              pTVar9 = ppTStack_230[-1] + 0x80;
            }
            if (pTVar9[-1] == ArrayRow) {
              if (pTVar18 < pTVar12) {
                local_2c8._8_8_ = (long)&pTVar12[-1].m_subtype + 3;
                stack0xfffffffffffffd48 = (pointer)0x1;
                local_2c8._0_8_ = pTVar18;
                std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
                emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)local_2c8);
                pTVar18 = pTVar12;
              }
              pTVar9 = local_248;
              if (local_248 == pTStack_240) {
                pTVar9 = ppTStack_230[-1] + 0x80;
              }
              stack0xfffffffffffffd48 = (pointer)CONCAT44(Stop,pTVar9[-1]);
              local_2c8._0_8_ = pTVar18;
              local_2c8._8_8_ = pTVar12;
              std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
              emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)local_2c8);
              if (local_248 == pTStack_240) {
                operator_delete(pTStack_240,0x200);
                pTStack_240 = ppTStack_230[-1];
                local_238 = pTStack_240 + 0x80;
                local_248 = pTStack_240 + 0x7f;
                ppTStack_230 = ppTStack_230 + -1;
              }
              else {
                local_248 = local_248 + -1;
              }
              stack0xfffffffffffffd48 = (pointer)0x100000004;
              local_2c8._0_8_ = pTVar18;
              local_2c8._8_8_ = pTVar12;
              std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
              emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)local_2c8);
              local_2c8._0_4_ = 4;
              std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>::
              emplace_back<xlfparser::Token::Type>
                        ((deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_> *)
                         local_278,(Type *)local_2c8);
              goto LAB_00177774;
            }
          }
          if (wVar2 == local_214._M_value) {
            if (pTVar18 < pTVar12) {
              local_2c8._8_8_ = (long)&pTVar12[-1].m_subtype + 3;
              stack0xfffffffffffffd48 = (pointer)0x1;
              local_2c8._0_8_ = pTVar18;
              std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
              emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)local_2c8);
              pvVar16 = (vector<xlfparser::Token,_std::allocator<xlfparser::Token>_> *)
                        ((ulong)pvVar16 & 0xffffffff);
              pTVar18 = pTVar12;
            }
            if (local_248 == (_Elt_pointer)local_278._16_8_) {
              prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
              local_2c8._0_8_ = local_2c8 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_2c8,"Mismatched braces","");
              std::runtime_error::runtime_error(prVar10,(string *)local_2c8);
              *(undefined ***)prVar10 = &PTR__runtime_error_001b8900;
              __cxa_throw(prVar10,&invalid_formula::typeinfo,std::runtime_error::~runtime_error);
            }
            pTVar9 = local_248;
            if (local_248 == pTStack_240) {
              pTVar9 = ppTStack_230[-1] + 0x80;
            }
            stack0xfffffffffffffd48 = (pointer)CONCAT44(Stop,pTVar9[-1]);
            local_2c8._0_8_ = pTVar18;
            local_2c8._8_8_ = pTVar12;
            std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
            emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)local_2c8);
            if (local_248 == pTStack_240) {
              operator_delete(pTStack_240,0x200);
              pTStack_240 = ppTStack_230[-1];
              local_238 = pTStack_240 + 0x80;
              local_248 = pTStack_240 + 0x7f;
              ppTStack_230 = ppTStack_230 + -1;
            }
            else {
              local_248 = local_248 + -1;
            }
            pTVar9 = local_248;
            if (local_248 == pTStack_240) {
              pTVar9 = ppTStack_230[-1] + 0x80;
            }
            stack0xfffffffffffffd48 = (pointer)CONCAT44(2,pTVar9[-1]);
            local_2c8._0_8_ = pTVar18;
            local_2c8._8_8_ = pTVar12;
            std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
            emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)local_2c8);
            if (local_248 == pTStack_240) {
              operator_delete(pTStack_240,0x200);
              pTStack_240 = ppTStack_230[-1];
              local_238 = pTStack_240 + 0x80;
              local_248 = pTStack_240 + 0x7f;
              ppTStack_230 = ppTStack_230 + -1;
            }
            else {
              local_248 = local_248 + -1;
            }
LAB_00177b4d:
            pvVar16 = (vector<xlfparser::Token,_std::allocator<xlfparser::Token>_> *)
                      ((ulong)pvVar16 & 0xffffffff);
            pTVar12 = (pointer)((long)&((pair<const_wchar_t_*,_const_wchar_t_*> *)&pTVar12->m_start)
                                       ->first + 1);
            size_00 = local_2a0;
            pTVar18 = pTVar12;
            goto LAB_001773f4;
          }
          local_2a4 = uVar15;
          if (wVar2 == L' ') {
            local_2c8._0_8_ = pTVar18;
            if (pTVar18 < pTVar12) {
              local_2c8._8_8_ = (long)&pTVar12[-1].m_subtype + 3;
              stack0xfffffffffffffd48 = (pointer)0x1;
              std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
              emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)local_2c8);
              local_2c8._0_8_ = pTVar12;
            }
            do {
              pTVar18 = pTVar12;
              if (size_00 <= pTVar18) break;
              pTVar12 = (pointer)((long)&((pair<const_wchar_t_*,_const_wchar_t_*> *)
                                         &pTVar18->m_start)->first + 1);
            } while (formula[(long)pTVar18] == L' ');
            local_2c8._8_8_ = (long)&pTVar18[-1].m_subtype + 3;
            stack0xfffffffffffffd48 = (pointer)0xa;
            std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
            emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)local_2c8);
            pTVar12 = pTVar18;
            goto LAB_00177498;
          }
          pTVar17 = (pointer)((long)&((pair<const_wchar_t_*,_const_wchar_t_*> *)&pTVar12->m_start)->
                                     first + 2);
          if (pTVar17 <= size_00) {
            bVar3 = false;
            ppuVar19 = &PTR_anon_var_dwarf_1e6ade_001b88d8;
            __s = L">=";
            local_294 = uVar13;
            local_280 = pTVar18;
            local_200 = pTVar17;
            do {
              sVar7 = wcslen(__s);
              if ((sVar7 == 2) && (iVar4 = wcsncmp(__s,pwVar20,2), iVar4 == 0)) {
                local_2c8._0_8_ = local_280;
                if (local_280 < pTVar12) {
                  local_2c8._8_8_ = (long)&pTVar12[-1].m_subtype + 3;
                  stack0xfffffffffffffd48 = (pointer)0x1;
                  std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
                  emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)local_2c8);
                  local_2c8._0_8_ = pTVar12;
                }
                formula = local_290;
                size_00 = local_2a0;
                local_2c8._8_8_ =
                     (long)&((pair<const_wchar_t_*,_const_wchar_t_*> *)&pTVar12->m_start)->first + 1
                ;
                stack0xfffffffffffffd48 = (pointer)0x500000008;
                std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
                emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)local_2c8);
                pTVar12 = local_200;
                pTVar18 = local_200;
                break;
              }
              __s = (wchar_t *)*ppuVar19;
              ppuVar19 = ppuVar19 + 1;
              bVar3 = __s == (wchar_t *)0x0;
              size_00 = local_2a0;
              pTVar18 = local_280;
              formula = local_290;
            } while (!bVar3);
            uVar14 = (ulong)local_294;
            pvVar16 = (vector<xlfparser::Token,_std::allocator<xlfparser::Token>_> *)
                      (ulong)local_2a4;
            if (!bVar3) goto LAB_001773f4;
          }
          bVar3 = true;
          if (formula[(long)pTVar12] != L'+') {
            pwVar20 = L"+-*/^&=><@";
            do {
              pwVar20 = pwVar20 + 1;
              wVar2 = *pwVar20;
              bVar3 = wVar2 != L'\0';
              if (wVar2 == L'\0') goto LAB_00177d18;
            } while (wVar2 != formula[(long)pTVar12]);
          }
          if (pTVar18 < pTVar12) {
            local_2c8._8_8_ = (long)&pTVar12[-1].m_subtype + 3;
            stack0xfffffffffffffd48 = (pointer)0x1;
            local_2c8._0_8_ = pTVar18;
            std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
            emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)local_2c8);
            pTVar18 = pTVar12;
          }
          stack0xfffffffffffffd48 = (pointer)0x8;
          local_2c8._0_8_ = pTVar18;
          local_2c8._8_8_ = pTVar12;
          std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
          emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)local_2c8);
          pvVar16 = (vector<xlfparser::Token,_std::allocator<xlfparser::Token>_> *)(ulong)local_2a4;
LAB_00177d18:
          if (!bVar3) {
            if (formula[(long)pTVar12] == L'%') {
              if (pTVar18 < pTVar12) {
                local_2c8._8_8_ = (long)&pTVar12[-1].m_subtype + 3;
                stack0xfffffffffffffd48 = (pointer)0x1;
                local_2c8._0_8_ = pTVar18;
                std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
                emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)local_2c8);
                pTVar18 = pTVar12;
              }
              stack0xfffffffffffffd48 = (pointer)0x9;
              local_2c8._0_8_ = pTVar18;
              local_2c8._8_8_ = pTVar12;
              std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
              emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)local_2c8);
              bVar3 = true;
              pvVar16 = (vector<xlfparser::Token,_std::allocator<xlfparser::Token>_> *)
                        (ulong)local_2a4;
            }
            uVar15 = (uint)pvVar16;
            if (!bVar3) {
              wVar2 = formula[(long)pTVar12];
              if (wVar2 == L'(') {
                if (pTVar18 < pTVar12) {
                  local_2c8._8_8_ = (long)&pTVar12[-1].m_subtype + 3;
                  stack0xfffffffffffffd48 = (pointer)0x100000002;
                  local_2c8._0_8_ = pTVar18;
                  std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
                  emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)local_2c8);
                  local_2c8._0_4_ = 2;
                  std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>::
                  emplace_back<xlfparser::Token::Type>
                            ((deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>
                              *)local_278,(Type *)local_2c8);
                }
                else {
                  stack0xfffffffffffffd48 = (pointer)0x100000005;
                  local_2c8._0_8_ = pTVar18;
                  local_2c8._8_8_ = pTVar12;
                  std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
                  emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)local_2c8);
                  local_2c8._0_4_ = 5;
                  std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>::
                  emplace_back<xlfparser::Token::Type>
                            ((deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>
                              *)local_278,(Type *)local_2c8);
                }
                goto LAB_00177b4d;
              }
              uVar13 = (uint)uVar14;
              if (wVar2 != local_218._M_value) {
                size_00 = local_2a0;
                if (wVar2 != L')') goto LAB_001773ee;
                if (pTVar18 < pTVar12) {
                  local_2c8._8_8_ = (long)&pTVar12[-1].m_subtype + 3;
                  stack0xfffffffffffffd48 = (pointer)0x1;
                  local_2c8._0_8_ = pTVar18;
                  std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
                  emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)local_2c8);
                  pTVar18 = pTVar12;
                }
                if (local_248 == (_Elt_pointer)local_278._16_8_) {
                  prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
                  local_2c8._0_8_ = local_2c8 + 0x10;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_2c8,"Mismatched parentheses","");
                  std::runtime_error::runtime_error(prVar10,(string *)local_2c8);
                  *(undefined ***)prVar10 = &PTR__runtime_error_001b8900;
                  __cxa_throw(prVar10,&invalid_formula::typeinfo,std::runtime_error::~runtime_error)
                  ;
                }
                pTVar9 = local_248;
                if (local_248 == pTStack_240) {
                  pTVar9 = ppTStack_230[-1] + 0x80;
                }
                stack0xfffffffffffffd48 = (pointer)CONCAT44(2,pTVar9[-1]);
                local_2c8._0_8_ = pTVar18;
                local_2c8._8_8_ = pTVar12;
                std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
                emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)local_2c8);
                if (local_248 == pTStack_240) {
                  operator_delete(pTStack_240,0x200);
                  pTStack_240 = ppTStack_230[-1];
                  local_238 = pTStack_240 + 0x80;
                  local_248 = pTStack_240 + 0x7f;
                  ppTStack_230 = ppTStack_230 + -1;
                }
                else {
                  local_248 = local_248 + -1;
                }
                goto LAB_00177774;
              }
              local_2c8._0_8_ = pTVar18;
              if (pTVar18 < pTVar12) {
                local_2c8._8_8_ = (long)&pTVar12[-1].m_subtype + 3;
                stack0xfffffffffffffd48 = (pointer)0x1;
                std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
                emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)local_2c8);
                local_2c8._0_8_ = pTVar12;
              }
              if (local_248 == (_Elt_pointer)local_278._16_8_) {
LAB_00177fad:
                uVar5 = 8;
                uVar11 = 0xb;
              }
              else {
                pTVar9 = local_248;
                if (local_248 == pTStack_240) {
                  pTVar9 = ppTStack_230[-1] + 0x80;
                }
                if (pTVar9[-1] != Function) goto LAB_00177fad;
                uVar5 = 6;
                uVar11 = 0;
              }
              stack0xfffffffffffffd48 = (pointer)CONCAT44(uVar11,uVar5);
              local_2c8._8_8_ = pTVar12;
              std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
              emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)local_2c8);
              goto LAB_00177774;
            }
          }
          pTVar12 = (pointer)((long)&((pair<const_wchar_t_*,_const_wchar_t_*> *)&pTVar12->m_start)->
                                     first + 1);
          size_00 = local_2a0;
          pTVar18 = pTVar12;
        }
      }
      else {
        pTVar12 = (pointer)((long)&((pair<const_wchar_t_*,_const_wchar_t_*> *)&pTVar17->m_start)->
                                   first + 1);
        ppuVar19 = &PTR_anon_var_dwarf_1e6a4e_001b8888;
        pwVar20 = L"#NULL!";
        local_2a4 = (uint)pvVar16;
        local_294 = uVar13;
        local_280 = pTVar17;
        do {
          sVar7 = wcslen(pwVar20);
          if ((sVar7 == (long)pTVar12 - (long)pTVar18) &&
             (iVar4 = wcsncmp(pwVar20,formula + (long)pTVar18,sVar7),
             __return_storage_ptr__ = local_220, iVar4 == 0)) {
            local_2c8._8_8_ = local_280;
            stack0xfffffffffffffd48 = (pointer)0x600000001;
            local_2c8._0_8_ = pTVar18;
            std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
            emplace_back<xlfparser::Token>(local_220,(Token *)local_2c8);
            local_284 = 0;
            uVar14 = (ulong)local_294;
            pvVar16 = (vector<xlfparser::Token,_std::allocator<xlfparser::Token>_> *)
                      (ulong)local_2a4;
            size_00 = local_2a0;
            pTVar18 = pTVar12;
            formula = local_290;
            goto LAB_001773f4;
          }
          pwVar20 = (wchar_t *)*ppuVar19;
          ppuVar19 = ppuVar19 + 1;
        } while (pwVar20 != (wchar_t *)0x0);
        uVar14 = (ulong)local_294;
        size_00 = local_2a0;
        __return_storage_ptr__ = local_220;
        formula = local_290;
LAB_00177498:
        pvVar16 = (vector<xlfparser::Token,_std::allocator<xlfparser::Token>_> *)(ulong)local_2a4;
      }
    }
    else {
      if (wVar2 == L'\"') {
        pTVar12 = (pointer)((long)&((pair<const_wchar_t_*,_const_wchar_t_*> *)&pTVar17->m_start)->
                                   first + 2);
        if ((size_00 < pTVar12) || (pwVar20[1] != L'\"')) {
          stack0xfffffffffffffd48 = (pointer)0x300000001;
          local_2c8._0_8_ = pTVar18;
          local_2c8._8_8_ = pTVar17;
          std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
          emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)local_2c8);
          pTVar12 = (pointer)((long)&((pair<const_wchar_t_*,_const_wchar_t_*> *)&pTVar17->m_start)->
                                     first + 1);
          pvVar16 = (vector<xlfparser::Token,_std::allocator<xlfparser::Token>_> *)0x0;
          pTVar18 = pTVar12;
        }
        goto LAB_001773f4;
      }
LAB_001773ee:
      pTVar12 = (pointer)((long)&((pair<const_wchar_t_*,_const_wchar_t_*> *)&pTVar12->m_start)->
                                 first + 1);
    }
LAB_001773f4:
    pTVar17 = pTVar12;
  } while (pTVar12 < size_00);
  if ((pTVar18 < pTVar12) &&
     ((pTVar17 = (__return_storage_ptr__->
                 super__Vector_base<xlfparser::Token,_std::allocator<xlfparser::Token>_>)._M_impl.
                 super__Vector_impl_data._M_finish,
      (__return_storage_ptr__->
      super__Vector_base<xlfparser::Token,_std::allocator<xlfparser::Token>_>)._M_impl.
      super__Vector_impl_data._M_start == pTVar17 || ((pointer)pTVar17[-1].m_end < pTVar18)))) {
    local_2c8._8_8_ = (long)&pTVar12[-1].m_subtype + 3;
    stack0xfffffffffffffd48 = (pointer)0x1;
    local_2c8._0_8_ = pTVar18;
    std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::emplace_back<xlfparser::Token>
              (__return_storage_ptr__,(Token *)local_2c8);
  }
  std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::vector
            (&local_1f0,__return_storage_ptr__);
  _fix_whitespace_tokens<wchar_t>
            ((vector<xlfparser::Token,_std::allocator<xlfparser::Token>_> *)local_2c8,&local_1f0,
             formula,(size_t)size_00);
  options_00 = local_1f8;
  std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::_M_move_assign
            (__return_storage_ptr__,local_2c8);
  if ((pointer)local_2c8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_2c8._0_8_,(long)stack0xfffffffffffffd48 - local_2c8._0_8_);
  }
  pwVar20 = local_290;
  if (local_1f0.super__Vector_base<xlfparser::Token,_std::allocator<xlfparser::Token>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1f0.
                    super__Vector_base<xlfparser::Token,_std::allocator<xlfparser::Token>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1f0.
                          super__Vector_base<xlfparser::Token,_std::allocator<xlfparser::Token>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1f0.
                          super__Vector_base<xlfparser::Token,_std::allocator<xlfparser::Token>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  _infer_token_subtypes<wchar_t>(__return_storage_ptr__,options_00,pwVar20,(size_t)size_00);
  std::_Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>::~_Deque_base
            ((_Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_> *)
             local_278);
  std::__cxx11::basic_regex<wchar_t,_std::__cxx11::regex_traits<wchar_t>_>::~basic_regex(&local_1d8)
  ;
  std::__cxx11::wstringstream::~wstringstream((wstringstream *)local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<Token> tokenize(const char_type *formula, size_t size, const Options<char_type>& options)
    {
        // Basic checks to make sure it's a valid formula
        if (size < 2 || formula[0] != '=')
            throw invalid_formula("Invalid Excel formula");

        // Chars used in parsing excel formual
        const char_type QUOTE_DOUBLE  = XLFP_CHAR('"');
        const char_type QUOTE_SINGLE  = XLFP_CHAR('\'');
        const char_type PAREN_OPEN    = XLFP_CHAR('(');
        const char_type PAREN_CLOSE   = XLFP_CHAR(')');
        const char_type WHITESPACE    = XLFP_CHAR(' ');
        const char_type ERROR_START   = XLFP_CHAR('#');

        // Some chars can be changed in the options
        const auto left_brace = options.left_brace.value_or(XLFP_CHAR('{'));
        const auto right_brace = options.right_brace.value_or(XLFP_CHAR('}'));
        const auto left_bracket = options.left_bracket.value_or(XLFP_CHAR('['));
        const auto right_bracket = options.right_brace.value_or(XLFP_CHAR(']'));
        const auto list_separator = options.list_separator.value_or(XLFP_CHAR(','));
        const auto decimal_separator = options.decimal_separator.value_or(XLFP_CHAR('.'));
        const auto row_separator = options.row_separator.value_or(XLFP_CHAR(';'));

        const char_type* OPERATORS_INFIX   = XLFP_STRING("+-*/^&=><@");
        const char_type* OPERATORS_POSTFIX = XLFP_STRING("%");

        // This matches a number in scientific notation with or without numbers after the + or -.
        // It's used to test for SN numbers before checking for +/- operators.
        std::basic_stringstream<char_type> sn_regex_ss;
        sn_regex_ss << R"(^[1-9](\)" << decimal_separator << R"(\d+)?E[+-]\d*$)";
        const std::basic_regex<char_type> sn_regex(sn_regex_ss.str(),
            std::regex_constants::ECMAScript |
            std::regex_constants::icase);

        const char_type* ERRORS[] = {
                XLFP_STRING("#NULL!"),
                XLFP_STRING("#DIV/0!"),
                XLFP_STRING("#VALUE!"),
                XLFP_STRING("#REF!"),
                XLFP_STRING("#NAME?"),
                XLFP_STRING("#NUM!"),
                XLFP_STRING("#N/A"),
                XLFP_STRING("#SPILL!"),
                NULL
        };

        const char_type* COMPARATORS_MULTI[] = {
                XLFP_STRING(">="),
                XLFP_STRING("<="),
                XLFP_STRING("<>"),
                NULL
        };

        bool in_string = false;
        bool in_path = false;
        bool in_range = false;
        bool in_error = false;

        std::vector<Token> tokens;
        std::stack<Token::Type> stack;

        size_t index = 1;  // first char is always '='
        size_t start = index;  // start of the current token
        while(index < size && formula[index] != L'\0')
        {
            // state-dependent character evaluation (order is important)

            // double-quoted strings
            // embeds are doubled
            // end marks token
            if (in_string) {
                if (formula[index] == QUOTE_DOUBLE)
                {
                    if (((index + 2) <= size) && (formula[index + 1] == QUOTE_DOUBLE))
                    {
                        // '""' is a quoted '"' so skip both
                        index += 2;
                        continue;
                    }

                    // add the string token, exit the string and continue
                    tokens.push_back(Token(start, index, Token::Type::Operand, Token::Subtype::Text));
                    start = ++index;
                    in_string = false;
                    continue;
                }

                ++index;
                continue;
            }

            // single-quoted strings (links)
            // embeds are double
            // end does not mark a token
            if (in_path)
            {
                if (formula[index] == QUOTE_SINGLE)
                {
                    if (((index + 2) <= size) && (formula[index + 1] == QUOTE_SINGLE))
                    {
                        // '' is a quoted ' so skip both
                        index += 2;
                        continue;
                    }

                    in_path = false;
                }

                ++index;
                continue;
            }

            // bracketed strings (R1C1 range index or linked workbook name)
            // no embeds (changed to "()" by Excel)
            // end does not mark a token
            if (in_range)
            {
                if (formula[index] == right_bracket)
                    in_range = false;

                index++;
                continue;
            }

            // error values
            // end marks a token, determined from absolute list of values
            if (in_error)
            {
                for (auto err = &ERRORS[0]; *err != NULL; ++err)
                {
                    if (_str_equals(*err, _tcslen(*err), &formula[start], 1 + index - start))
                    {
                        // add the string token, exit the string and continue
                        tokens.push_back(Token(start, index, Token::Type::Operand, Token::Subtype::Error));
                        start = index + 1;
                        in_error = false;
                        break;
                    }
                }

                ++index;
                continue;
            }

            // scientific notation check
            if (index > start)
            {
                if (std::regex_match(&formula[start], &formula[index]+1, sn_regex))
                {
                    ++index;
                    continue;
                }
            }

            // independent character evaluation (order not important)
            // establish state-dependent character evaluations
            if (formula[index] == QUOTE_DOUBLE) {
                if (index > start)
                {
                    tokens.push_back(Token(start, index-1, Token::Type::Unknown, Token::Subtype::None));
                    start = index;
                }

                in_string = true;
                ++index;
                continue;
            }

            if (formula[index] == QUOTE_SINGLE)
            {
                if (index > start)
                {
                    tokens.push_back(Token(start, index-1, Token::Type::Unknown, Token::Subtype::None));
                    start = index;
                }

                in_path = true;
                ++index;
                continue;
            }

            if (formula[index] == left_bracket)
            {
                in_range = true;
                ++index;
                continue;
            }

            if (formula[index] == ERROR_START)
            {
                if (index > start)
                {
                    tokens.push_back(Token(start, index-1, Token::Type::Unknown, Token::Subtype::None));
                    start = index;
                }

                in_error = true;
                ++index;
                continue;
            }

            // mark start and end of arrays and array rows
            if (formula[index] == left_brace)
            {
                if (index > start)
                {
                    tokens.push_back(Token(start, index-1, Token::Type::Unknown, Token::Subtype::None));
                    start = index;
                }

                tokens.push_back(Token(start, index, Token::Type::Array, Token::Subtype::Start));
                tokens.push_back(Token(start, index, Token::Type::ArrayRow, Token::Subtype::Start));

                stack.push(Token::Type::Array);
                stack.push(Token::Type::ArrayRow);

                start = ++index;
                continue;
            }

            if (formula[index] == row_separator && !stack.empty() && stack.top() == Token::Type::ArrayRow)
            {
                if (index > start)
                {
                    tokens.push_back(Token(start, index-1, Token::Type::Operand, Token::Subtype::None));
                    start = index;
                }

                tokens.push_back(Token(start, index, stack.top(), Token::Subtype::Stop));
                stack.pop();

                tokens.push_back(Token(start, index, Token::Type::ArrayRow, Token::Subtype::Start));
                stack.push(Token::Type::ArrayRow);

                start = ++index;
                continue;
            }

            if (formula[index] == right_brace)
            {
                if (index > start)
                {
                    tokens.push_back(Token(start, index-1, Token::Type::Operand, Token::Subtype::None));
                    start = index;
                }

                if (stack.empty())
                    throw invalid_formula("Mismatched braces");

                tokens.push_back(Token(start, index, stack.top(), Token::Subtype::Stop));
                stack.pop();

                tokens.push_back(Token(start, index, stack.top(), Token::Subtype::Stop));
                stack.pop();

                start = ++index;
                continue;
            }

            // trim white-space
            if (formula[index] == WHITESPACE)
            {
                if (index > start)
                {
                    tokens.push_back(Token(start, index-1, Token::Type::Operand, Token::Subtype::None));
                    start = index;
                }

                while ((formula[index] == WHITESPACE) && (index < size))
                    index++;

                tokens.push_back(Token(start, index-1, Token::Type::Whitespace, Token::Subtype::None));

                start = index;
                continue;
            }

            // multi-character comparators
            if ((index + 2) <= size)
            {
                bool foundOp = false;
                for (auto op = &COMPARATORS_MULTI[0]; *op != NULL; ++op)
                {
                    if (_str_equals(*op, _tcslen(*op), &formula[index], 2))
                    {
                        if (index > start)
                        {
                            tokens.push_back(Token(start, index-1, Token::Type::Operand, Token::Subtype::None));
                            start = index;
                        }

                        tokens.push_back(Token(start, index+1, Token::Type::OperatorInfix, Token::Subtype::Logical));
                        foundOp = true;
                        break;
                    }
                }

                if (foundOp)
                {
                    index += 2;
                    start = index;
                    continue;
                }
            }

            // standard infix operators
            bool foundOp = false;
            for (auto op = OPERATORS_INFIX; *op != L'\0'; ++op)
            {
                if (*op == formula[index])
                {
                    if (index > start)
                    {
                        tokens.push_back(Token(start, index-1, Token::Type::Operand, Token::Subtype::None));
                        start = index;
                    }

                    tokens.push_back(Token(start, index, Token::Type::OperatorInfix, Token::Subtype::None));
                    foundOp = true;
                    break;
                }
            }

            if (foundOp)
            {
                start = ++index;
                continue;
            }

            // standard postfix operators
            for (auto op = OPERATORS_POSTFIX; *op != L'\0'; ++op)
            {
                if (*op == formula[index])
                {
                    if (index > start)
                    {
                        tokens.push_back(Token(start, index-1, Token::Type::Operand, Token::Subtype::None));
                        start = index;
                    }

                    tokens.push_back(Token(start, index, Token::Type::OperatorPostfix, Token::Subtype::None));
                    foundOp = true;
                    break;
                }
            }

            if (foundOp)
            {
                start = ++index;
                continue;
            }

            // start subexpression or function
            if (formula[index] == PAREN_OPEN)
            {
                if (index > start)
                {
                    tokens.push_back(Token(start, index-1, Token::Type::Function, Token::Subtype::Start));
                    stack.push(Token::Type::Function);
                }
                else
                {
                    tokens.push_back(Token(start, index, Token::Type::Subexpression, Token::Subtype::Start));
                    stack.push(Token::Type::Subexpression);
                }

                start = ++index;
                continue;
            }

            // function, subexpression, or array parameters, or operand unions
            if (formula[index] == list_separator)
            {
                if (index > start)
                {
                    tokens.push_back(Token(start, index-1, Token::Type::Operand, Token::Subtype::None));
                    start = index;
                }

                auto type = (!stack.empty() && stack.top() == Token::Type::Function)
                                ? std::make_tuple(Token::Type::Argument, Token::Subtype::None)
                                : std::make_tuple(Token::Type::OperatorInfix, Token::Subtype::Union);

                tokens.push_back(Token(start, index, std::get<0>(type), std::get<1>(type)));

                start = ++index;
                continue;
            }

            // stop subexpression
            if (formula[index] == PAREN_CLOSE)
            {
                if (index > start)
                {
                    tokens.push_back(Token(start, index-1, Token::Type::Operand, Token::Subtype::None));
                    start = index;
                }

                if (stack.empty())
                    throw invalid_formula("Mismatched parentheses");

                tokens.push_back(Token(start, index, stack.top(), Token::Subtype::Stop));
                stack.pop();

                start = ++index;
                continue;
            }

            // token accumulation
            ++index;
        }

        // dump remaining accumulation, if any
        if (index > start && (tokens.empty() || tokens.back().end() < start))
            tokens.push_back(Token(start, index-1, Token::Type::Operand, Token::Subtype::None));

        // label intersection operators specified as whitespace correctly
        tokens = _fix_whitespace_tokens(tokens, formula, size);

        // set the token subtypes correctly
        _infer_token_subtypes(tokens, options, formula, size);

        return tokens;
    }